

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
FastVector<char,_true,_true>::grow_no_destroy(FastVector<char,_true,_true> *this,uint newSize)

{
  char *dst;
  uint uVar1;
  uint size;
  
  uVar1 = (this->max >> 1) + this->max;
  size = newSize + 0x20;
  if (newSize < uVar1) {
    size = uVar1;
  }
  dst = (char *)NULLC::alignedAlloc(size);
  if (dst != (char *)0x0) {
    NULLC::fillMemory(dst,0,(ulong)size);
    if (this->data != (char *)0x0) {
      NULLC::copyMemory(dst,this->data,(ulong)this->max);
    }
    this->data = dst;
    this->max = size;
    return;
  }
  __assert_fail("newData",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0xa7,
                "void FastVector<char, true, true>::grow_no_destroy(unsigned int) [T = char, zeroNewMemory = true, skipConstructor = true]"
               );
}

Assistant:

void grow_no_destroy(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 32;

		T* newData;

		if(!skipConstructor)
			newData = NULLC::construct<T>(newSize);
		else
			newData = (T*)NULLC::alignedAlloc(sizeof(T) * newSize);

		assert(newData);

		if(zeroNewMemory)
			NULLC::fillMemory(newData, 0, newSize * sizeof(T));

		if(data)
			NULLC::copyMemory(newData, data, max * sizeof(T));

		data = newData;
		max = newSize;
	}